

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

SmallVectorBase<slang::IntervalMapDetails::Path::Entry> * __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *rhs)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pEVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pEVar6;
  undefined8 uVar7;
  size_type sVar8;
  long lVar9;
  
  if (this == rhs) {
    return this;
  }
  pEVar3 = rhs->data_;
  if (pEVar3 != (pointer)rhs->firstElement) {
    cleanup(this,(EVP_PKEY_CTX *)pEVar3);
    pEVar3 = rhs->data_;
    rhs->data_ = (pointer)0x0;
    this->data_ = pEVar3;
    sVar8 = rhs->len;
    rhs->len = 0;
    this->len = sVar8;
    sVar8 = rhs->cap;
    rhs->cap = 0;
    this->cap = sVar8;
    return this;
  }
  uVar4 = this->len;
  uVar5 = rhs->len;
  if (uVar4 < uVar5) {
    if (this->cap < uVar5) {
      this->len = 0;
      reserve(this,rhs->len);
    }
    else if (uVar4 != 0) {
      memmove(this->data_,pEVar3,uVar4 << 4);
    }
    pEVar3 = rhs->data_;
    sVar8 = rhs->len;
    pEVar6 = this->data_;
    for (lVar9 = this->len << 4; sVar8 << 4 != lVar9; lVar9 = lVar9 + 0x10) {
      puVar1 = (undefined8 *)((long)&pEVar3->node + lVar9);
      puVar2 = (undefined8 *)((long)&pEVar6->node + lVar9);
      uVar7 = puVar1[1];
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
    }
  }
  else {
    if (uVar5 == 0) {
      sVar8 = 0;
      goto LAB_0032de8b;
    }
    memmove(this->data_,pEVar3,uVar5 << 4);
  }
  sVar8 = rhs->len;
LAB_0032de8b:
  this->len = sVar8;
  rhs->len = 0;
  return this;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(SmallVectorBase<T>&& rhs) {
    if (this == &rhs)
        return *this;

    // If the rhs isn't small, clear this vector and then steal its buffer.
    if (!rhs.isSmall()) {
        cleanup();
        this->data_ = std::exchange(rhs.data_, nullptr);
        this->len = std::exchange(rhs.len, 0);
        this->cap = std::exchange(rhs.cap, 0);
        return *this;
    }

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::move(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        rhs.clear();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::move(rhs.begin(), rhs.begin() + len, begin());
    }

    // Move construct the new elements in place.
    std::uninitialized_move(rhs.begin() + len, rhs.end(), begin() + len);
    len = rhs.size();
    rhs.clear();
    return *this;
}